

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::doRemoveRows(SPxSolverBase<double> *this,int *perm)

{
  SPxStatus SVar1;
  long *in_RDI;
  SPxLPBase<double> *unaff_retaddr;
  int *in_stack_00000008;
  SPxBasisBase<double> *in_stack_00000010;
  SPxBasisBase<double> *this_00;
  SPxStatus stat;
  undefined4 in_stack_ffffffffffffffe0;
  
  SPxLPBase<double>::doRemoveRows(unaff_retaddr,(int *)in_RDI);
  (**(code **)(*in_RDI + 0x3b8))();
  SVar1 = SPxBasisBase<double>::status((SPxBasisBase<double> *)(in_RDI + 0x39));
  if (SVar1 < SINGULAR) {
    return;
  }
  this_00 = (SPxBasisBase<double> *)(in_RDI + 0x39);
  SPxBasisBase<double>::removedRows(in_stack_00000010,in_stack_00000008);
  SVar1 = SPxBasisBase<double>::status(this_00);
  stat = (SPxStatus)((ulong)this_00 >> 0x20);
  if (SVar1 != DUAL) {
    if (SVar1 == OPTIMAL) {
      setBasisStatus((SPxSolverBase<double> *)CONCAT44(3,in_stack_ffffffffffffffe0),stat);
      return;
    }
    if (SVar1 != INFEASIBLE) {
      return;
    }
  }
  setBasisStatus((SPxSolverBase<double> *)CONCAT44(SVar1,in_stack_ffffffffffffffe0),stat);
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveRows(int perm[])
{

   SPxLPBase<R>::doRemoveRows(perm);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedRows(perm);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::DUAL:
      case SPxBasisBase<R>::INFEASIBLE:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::PRIMAL);
         break;

      default:
         break;
      }
   }
}